

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha_bugfix_0.c
# Opt level: O2

void test_read_format_lha_bugfix_0(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *v2;
  la_int64_t v2_00;
  archive_entry *ae;
  int64_t o;
  size_t s;
  void *pv;
  
  extract_reference_file("test_read_format_lha_bugfix_0.lzh");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                   ,L'%',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_lha_bugfix_0.lzh",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L')',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  v2 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
             ,L'-',"f","\"f\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  v2_00 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'.',0x308,"776",v2_00,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_data_block((archive *)a,&pv,&s,&o);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_data_block(a, &pv, &s, &o)",a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'1',s,"s",0x308,"776",(void *)0x0);
  iVar1 = archive_read_data_block((archive *)a,&pv,&s,&o);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'3',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_data_block(a, &pv, &s, &o)",a)
  ;
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'4',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'6',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'9',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'<',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'?',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'A',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'D',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'E',0xb0000,"ARCHIVE_FORMAT_LHA",(long)iVar1,"archive_format(a)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_bugfix_0.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_lha_bugfix_0)
{
	const char *refname = "test_read_format_lha_bugfix_0.lzh";
	struct archive_entry *ae;
	struct archive *a;
	const void *pv;
	size_t s;
	int64_t o;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify directory1.  */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("f", archive_entry_pathname(ae));
	assertEqualInt(776, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt(s, 776);
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a),
		ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify the number of files read. */
	assertEqualInt(1, archive_file_count(a));

	/* Verify encryption status */
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a),
		ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_LHA, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}